

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DACCtrl_PlayData_Loc(VGMPlayer *this)

{
  UINT32 DataPos;
  UINT32 Length;
  reference pvVar1;
  UINT32 soundLen;
  UINT32 startOfs;
  DACSTRM_DEV *dacStrm;
  size_t dsID;
  VGMPlayer *this_local;
  
  if (this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]] != 0xffffffffffffffff) {
    pvVar1 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
             operator[](&this->_dacStreams,
                        this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]]);
    DataPos = ReadLE32(this->_fileData + (ulong)this->_filePos + 2);
    Length = ReadLE32(this->_fileData + (ulong)this->_filePos + 7);
    pvVar1->lastItem = 0xffffffff;
    pvVar1->pbMode = this->_fileData[(ulong)this->_filePos + 6];
    daccontrol_start((pvVar1->defInf).dataPtr,DataPos,pvVar1->pbMode,Length);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_PlayData_Loc(void)	// DAC Stream Control: Play Data (verbose, by specifying location/size)
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	UINT32 startOfs = ReadLE32(&fData[0x02]);
	UINT32 soundLen = ReadLE32(&fData[0x07]);
	dacStrm->lastItem = (UINT32)-1;
	dacStrm->pbMode = fData[0x06];
	daccontrol_start(dacStrm->defInf.dataPtr, startOfs, dacStrm->pbMode, soundLen);
	return;
}